

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall
test_matrix_sparse_swap_Test::~test_matrix_sparse_swap_Test(test_matrix_sparse_swap_Test *this)

{
  test_matrix_sparse_swap_Test *this_local;
  
  ~test_matrix_sparse_swap_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_matrix_sparse, swap) {
  Matrix_Sparse matrix_0({0, 1, 2}, {1, 0}, {1.0, 2.0}, 2);
  Matrix_Sparse matrix_1({0, 1, 2, 3}, {1, 0, 1}, {3.0, 4.0, 5.0}, 3);

  matrix_0.swap(matrix_1);
  EXPECT_EQ(matrix_0.size_row(), 3);
  EXPECT_EQ(matrix_0.size_column(), 3);
  EXPECT_EQ(matrix_0.size_non_zero(), 3);
  EXPECT_EQ(matrix_1.size_row(), 2);
  EXPECT_EQ(matrix_1.size_column(), 2);
  EXPECT_EQ(matrix_1.size_non_zero(), 2);
  EXPECT_DOUBLE_EQ(matrix_0[0][1], 3.0);
  EXPECT_DOUBLE_EQ(matrix_0[1][0], 4.0);
  EXPECT_DOUBLE_EQ(matrix_0[2][1], 5.0);
  EXPECT_DOUBLE_EQ(matrix_1[0][1], 1.0);
  EXPECT_DOUBLE_EQ(matrix_1[1][0], 2.0);
}